

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::TiledInputFile::TiledInputFile(TiledInputFile *this,InputPartData *part)

{
  _func_int **pp_Var1;
  TiledInputFile *in_RSI;
  GenericInputFile *in_RDI;
  int in_stack_0000000c;
  Data *in_stack_00000010;
  size_t i;
  InputPartData *in_stack_ffffffffffffffe8;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__TiledInputFile_0040d890;
  pp_Var1 = (_func_int **)operator_new(0x180);
  Data::Data(in_stack_00000010,in_stack_0000000c);
  in_RDI[1]._vptr_GenericInputFile = pp_Var1;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x2f) = 0;
  multiPartInitialize(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

TiledInputFile::TiledInputFile (InputPartData* part) 
{
    _data = new Data (part->numThreads);
    _data->_deleteStream=false;
    try
    {
      multiPartInitialize(part);
    }
    catch(...)
    {
        if(_data)
        {
          if (!_data->memoryMapped)
          {
            for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            {
                if(_data->tileBuffers[i])
                {
                   delete [] _data->tileBuffers[i]->buffer;
                }
            }
          }
          delete _data;
        }
        throw;
    }
}